

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationDB.cpp
# Opt level: O3

AggregateEntry * __thiscall
aggregate::AggregationDB::find_or_create_entry
          (AggregationDB *this,SnapshotView key,size_t hash,size_t num_aggr_attrs,bool can_alloc)

{
  pointer *ppAVar1;
  pointer puVar2;
  iterator __position;
  pointer pAVar3;
  pointer pEVar4;
  AggregateEntry *pAVar5;
  bool bVar6;
  unsigned_long uVar7;
  size_t sVar8;
  ulong uVar9;
  pointer pAVar10;
  long lVar11;
  Entry *__first1;
  size_type __new_size;
  anon_union_8_7_33918203_for_value aVar12;
  anon_union_8_7_33918203_for_value aVar13;
  ulong uVar14;
  AggregateEntry e;
  value_type local_68;
  
  sVar8 = key.m_len;
  __first1 = key.m_data;
  puVar2 = (this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar9 = hash % (ulong)((long)(this->m_hashmap).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
  uVar7 = puVar2[uVar9];
  if (uVar7 == 0) {
    uVar14 = 1;
  }
  else {
    pAVar10 = (this->m_entries).
              super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar14 = 1;
    do {
      if (pAVar10[uVar7].key_len == sVar8) {
        bVar6 = std::__equal<false>::equal<cali::Entry_const*,cali::Entry*>
                          (__first1,__first1 + sVar8,
                           (this->m_keyents).
                           super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
                           super__Vector_impl_data._M_start + pAVar10[uVar7].key_idx);
        if (bVar6) {
          return pAVar10 + uVar7;
        }
        pAVar10 = (this->m_entries).
                  super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      uVar7 = pAVar10[uVar7].next_entry_idx;
      uVar14 = uVar14 + 1;
    } while (uVar7 != 0);
  }
  if (can_alloc) {
    aVar12.v_uint =
         ((long)(this->m_kernels).
                super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_kernels).
                super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
    __new_size = (long)aVar12.unmanaged_ptr + num_aggr_attrs;
  }
  else {
    pAVar3 = (this->m_kernels).
             super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    aVar12.v_uint =
         ((long)(this->m_kernels).
                super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar3 >> 3) * 0x6db6db6db6db6db7
    ;
    __new_size = (long)aVar12.unmanaged_ptr + num_aggr_attrs;
    if (((ulong)(((long)(this->m_kernels).
                        super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar3 >> 3) *
                0x6db6db6db6db6db7) <= __new_size) ||
       (pEVar4 = (this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       (ulong)(((long)(this->m_keyents).
                      super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage - (long)pEVar4 >> 3) *
              -0x5555555555555555) <=
       ((long)(this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pEVar4 >> 3) * -0x5555555555555555 +
       sVar8)) {
      return (this->m_entries).
             super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    }
    pAVar5 = (this->m_entries).
             super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_entries).
                       super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar5 >> 4) *
               -0x5555555555555555) <=
        ((long)(this->m_entries).
               super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5 >> 4) * -0x5555555555555555
        + 1U) {
      return pAVar5;
    }
  }
  local_68.sum.m_v.type_and_size = 0;
  local_68.sum.m_v.value.v_uint = 0;
  local_68.max.m_v.type_and_size = 0;
  local_68.max.m_v.value.v_uint = 0;
  local_68.min.m_v.type_and_size = 0;
  local_68.min.m_v.value.v_uint = 0;
  local_68.count = 0;
  std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::resize
            (&this->m_kernels,__new_size,&local_68);
  aVar13.v_uint =
       ((long)(this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<cali::Entry_const*,std::back_insert_iterator<std::vector<cali::Entry,std::allocator<cali::Entry>>>>
            (__first1,__first1 + sVar8,
             (back_insert_iterator<std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>)
             &this->m_keyents);
  local_68.min.m_v.type_and_size = 0;
  local_68.sum.m_v.value =
       *(anon_union_8_7_33918203_for_value *)
        ((this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
         .super__Vector_impl_data._M_start + uVar9);
  __position._M_current =
       (this->m_entries).
       super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  lVar11 = (long)__position._M_current -
           (long)(this->m_entries).
                 super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  if (__position._M_current ==
      (this->m_entries).
      super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_68.min.m_v.value.v_uint = aVar13.v_uint;
    local_68.max.m_v.type_and_size = sVar8;
    local_68.max.m_v.value = aVar12;
    local_68.sum.m_v.type_and_size = num_aggr_attrs;
    std::vector<aggregate::AggregateEntry,std::allocator<aggregate::AggregateEntry>>::
    _M_realloc_insert<aggregate::AggregateEntry_const&>
              ((vector<aggregate::AggregateEntry,std::allocator<aggregate::AggregateEntry>> *)
               &this->m_entries,__position,(AggregateEntry *)&local_68);
  }
  else {
    (__position._M_current)->num_kernels = num_aggr_attrs;
    (__position._M_current)->next_entry_idx = (size_t)local_68.sum.m_v.value;
    (__position._M_current)->key_len = sVar8;
    (__position._M_current)->kernels_idx = (size_t)aVar12;
    (__position._M_current)->count = 0;
    (__position._M_current)->key_idx = (size_t)aVar13;
    ppAVar1 = &(this->m_entries).
               super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppAVar1 = *ppAVar1 + 1;
  }
  (this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar9] = (lVar11 >> 4) * -0x5555555555555555;
  if (uVar14 < this->m_max_hash_len) {
    uVar14 = this->m_max_hash_len;
  }
  this->m_max_hash_len = uVar14;
  return (AggregateEntry *)
         (lVar11 + (long)(this->m_entries).
                         super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

AggregateEntry* AggregationDB::find_or_create_entry(SnapshotView key, std::size_t hash, std::size_t num_aggr_attrs, bool can_alloc)
{
    hash           = hash % m_hashmap.size();
    size_t key_len = key.size();
    size_t count   = 0;

    for (std::size_t idx = m_hashmap[hash]; idx != 0; idx = m_entries[idx].next_entry_idx) {
        AggregateEntry* e = &m_entries[idx];
        if (key_len == e->key_len && std::equal(key.begin(), key.end(), m_keyents.begin() + e->key_idx))
            return e;
        ++count;
    }

    // --- entry not found, check if we can create a new entry
    //

    if (!can_alloc) {
        if (m_kernels.size() + num_aggr_attrs >= m_kernels.capacity())
            return &m_entries[0];
        if (m_keyents.size() + key_len >= m_keyents.capacity())
            return &m_entries[0];
        if (m_entries.size() + 1 >= m_entries.capacity())
            return &m_entries[0];
    }

    size_t kernels_idx = m_kernels.size();
    m_kernels.resize(m_kernels.size() + num_aggr_attrs, AggregateKernel());

    size_t key_idx = m_keyents.size();
    std::copy(key.begin(), key.end(), std::back_inserter(m_keyents));

    AggregateEntry e;

    e.count          = 0;
    e.key_idx        = key_idx;
    e.key_len        = key_len;
    e.kernels_idx    = kernels_idx;
    e.num_kernels    = num_aggr_attrs;
    e.next_entry_idx = m_hashmap[hash];

    size_t entry_idx = m_entries.size();
    m_entries.push_back(e);
    m_hashmap[hash] = entry_idx;

    m_max_hash_len = std::max(m_max_hash_len, count + 1);

    return &m_entries[entry_idx];
}